

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

VariableIndex __thiscall
cnn::ComputationGraph::add_lookup
          (ComputationGraph *this,LookupParameters *p,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  size_type sVar1;
  LookupNode *this_00;
  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *in_RSI;
  LookupParameters *in_RDI;
  LookupNode *new_node;
  VariableIndex *new_node_index;
  uint uVar2;
  LookupParameters *p_00;
  uint local_24 [9];
  
  p_00 = in_RDI;
  sVar1 = std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::size(in_RSI);
  local_24[0] = (uint)sVar1;
  VariableIndex::VariableIndex((VariableIndex *)p_00,local_24);
  this_00 = (LookupNode *)operator_new(0xa8);
  LookupNode::LookupNode(this_00,p_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI)
  ;
  std::vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>::push_back(in_RSI,(value_type *)in_RDI);
  uVar2 = (uint)in_RDI;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::push_back
            ((vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> *)this_00,
             (value_type *)p_00);
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)indices);
  return (VariableIndex)uVar2;
}

Assistant:

VariableIndex ComputationGraph::add_lookup(LookupParameters* p, const std::vector<unsigned>* indices) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, indices);
  nodes.push_back(new_node);
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}